

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::IncrementVarUsage(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *this,int v)

{
  pointer pCVar1;
  int iVar2;
  int *piVar3;
  Error *this_00;
  ulong uVar4;
  
  piVar3 = VarUsageRef(this,v);
  *piVar3 = *piVar3 + 1;
  uVar4 = (ulong)v;
  pCVar1 = (this->var_info_).
           super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->var_info_).
                            super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4)) {
    iVar2 = (*(pCVar1[uVar4].pck_)->_vptr_BasicConstraintKeeper[0x21])
                      (pCVar1[uVar4].pck_,(ulong)(uint)pCVar1[uVar4].index_);
    if ((char)iVar2 != '\0') {
      pCVar1 = (this->var_info_).
               super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->var_info_).
                        super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4) <= uVar4)
      goto LAB_00309155;
      iVar2 = (*(pCVar1[uVar4].pck_)->_vptr_BasicConstraintKeeper[0x20])
                        (pCVar1[uVar4].pck_,(ulong)(uint)pCVar1[uVar4].index_);
      if ((char)iVar2 == '\0') {
        this_00 = (Error *)__cxa_allocate_exception(0x18);
        Error::Error(this_00,(CStringRef)0x49ef90,-1);
        __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
      }
    }
    return;
  }
LAB_00309155:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

void IncrementVarUsage(int v) {
		++VarUsageRef(v);
    // If unused, no reformulation tried,
    // currently no repetition of reformulation cycle.
    MP_ASSERT_ALWAYS(!IsUnused(GetInitExpression(v))
        || IsBridgingToBeConsidered(GetInitExpression(v)),
                     "An expression's redefinition\n"
                     "could be lost. Please contact\n"
                     "AMPL customer support.");
	}